

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer-crit.cpp
# Opt level: O2

vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *
getSlicingCriteriaValues
          (vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *__return_storage_ptr__
          ,Module *M,string *slicingCriteria,string *legacySlicingCriteria,
          string *legacySecondaryCriteria,bool criteria_are_next_instr)

{
  bool bVar1;
  long lVar2;
  raw_ostream *prVar3;
  pointer opt;
  SlicingCriteriaSet *critset;
  pointer pSVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  legacyCriteriaParts;
  string criteria;
  vector<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_> C;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)&criteria,(string *)slicingCriteria);
  bVar1 = std::operator!=(legacySlicingCriteria,"");
  if (bVar1) {
    splitList(&legacyCriteriaParts,legacySlicingCriteria,',');
    for (opt = legacyCriteriaParts.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
        opt != legacyCriteriaParts.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish; opt = opt + 1) {
      bVar1 = std::operator!=(&criteria,"");
      if (bVar1) {
        std::__cxx11::string::append((char *)&criteria);
      }
      splitList(&parts,opt,':');
      lVar2 = (long)parts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)parts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
      if (lVar2 == 1) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&C,opt,
                       "()");
        std::__cxx11::string::append((string *)&criteria);
      }
      else {
        if (lVar2 != 2) {
          prVar3 = (raw_ostream *)llvm::errs();
          prVar3 = llvm::raw_ostream::operator<<(prVar3,"Unsupported criteria: ");
          prVar3 = llvm::raw_ostream::operator<<(prVar3,opt);
          llvm::raw_ostream::operator<<(prVar3,"\n");
          (__return_storage_ptr__->
          super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>)._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->
          super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>)._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->
          super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&parts);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&legacyCriteriaParts);
          goto LAB_0013a22c;
        }
        std::operator+(&local_50,
                       parts.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,"#");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&C,
                       &local_50,
                       parts.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1);
        std::__cxx11::string::append((string *)&criteria);
        std::__cxx11::string::_M_dispose();
      }
      std::__cxx11::string::_M_dispose();
      bVar1 = std::operator!=(legacySecondaryCriteria,"");
      if (bVar1) {
        std::operator+(&local_50,"|",legacySecondaryCriteria);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&C,
                       &local_50,"()");
        std::__cxx11::string::append((string *)&criteria);
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&parts);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&legacyCriteriaParts);
  }
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  getSlicingCriteriaInstructions
            (&C,M,&criteria,criteria_are_next_instr,(LLVMPointerAnalysis *)0x0,false);
  for (pSVar4 = C.super__Vector_base<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pSVar4 != C.super__Vector_base<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_>.
                _M_impl.super__Vector_impl_data._M_finish; pSVar4 = pSVar4 + 1) {
    std::vector<llvm::Value_const*,std::allocator<llvm::Value_const*>>::
    insert<std::_Rb_tree_const_iterator<llvm::Value_const*>,void>
              ((vector<llvm::Value_const*,std::allocator<llvm::Value_const*>> *)
               __return_storage_ptr__,
               (const_iterator)
               (__return_storage_ptr__->
               super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>).
               _M_impl.super__Vector_impl_data._M_finish,
               (pSVar4->primary)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
               (_Rb_tree_const_iterator<const_llvm::Value_*>)
               &(pSVar4->primary)._M_t._M_impl.super__Rb_tree_header);
    std::vector<llvm::Value_const*,std::allocator<llvm::Value_const*>>::
    insert<std::_Rb_tree_const_iterator<llvm::Value_const*>,void>
              ((vector<llvm::Value_const*,std::allocator<llvm::Value_const*>> *)
               __return_storage_ptr__,
               (const_iterator)
               (__return_storage_ptr__->
               super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>).
               _M_impl.super__Vector_impl_data._M_finish,
               (pSVar4->secondary)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
               (_Rb_tree_const_iterator<const_llvm::Value_*>)
               &(pSVar4->secondary)._M_t._M_impl.super__Rb_tree_header);
  }
  std::vector<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_>::~vector(&C);
LAB_0013a22c:
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

std::vector<const llvm::Value *>
getSlicingCriteriaValues(llvm::Module &M, const std::string &slicingCriteria,
                         const std::string &legacySlicingCriteria,
                         const std::string &legacySecondaryCriteria,
                         bool criteria_are_next_instr) {
    std::string criteria = slicingCriteria;
    if (legacySlicingCriteria != "") {
        auto legacyCriteriaParts = splitList(legacySlicingCriteria, ',');
        for (auto &legacyCriterion : legacyCriteriaParts) {
            if (criteria != "")
                criteria += ";";

            auto parts = splitList(legacyCriterion, ':');
            if (parts.size() == 2) {
                criteria += parts[0] + "#" + parts[1];
            } else if (parts.size() == 1) {
                criteria += legacyCriterion + "()";
            } else {
                llvm::errs()
                        << "Unsupported criteria: " << legacyCriterion << "\n";
                return {};
            }
            if (legacySecondaryCriteria != "") {
                criteria += "|" + legacySecondaryCriteria + "()";
            }
        }
    }

    std::vector<const llvm::Value *> ret;
    auto C = getSlicingCriteriaInstructions(
            M, criteria, criteria_are_next_instr,
            /*pta = */ nullptr, /* constructed only */ false);
    for (auto &critset : C) {
        ret.insert(ret.end(), critset.primary.begin(), critset.primary.end());
        ret.insert(ret.end(), critset.secondary.begin(),
                   critset.secondary.end());
    }
    return ret;
}